

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFFormValue.cpp
# Opt level: O1

void __thiscall
llvm::DWARFFormValue::dump(DWARFFormValue *this,raw_ostream *OS,DIDumpOptions DumpOpts)

{
  Form FVar1;
  uint64_t uVar2;
  raw_ostream *this_00;
  size_t sVar3;
  size_t __n;
  uint uVar4;
  size_t sVar5;
  void *__buf;
  undefined8 SectionIndex;
  char *pcVar6;
  DWARFObject *Obj;
  uint8_t *puVar7;
  uint8_t *puVar8;
  StringRef Str;
  StringRef Str_00;
  StringRef Str_01;
  WithColor local_88;
  undefined1 local_78 [8];
  Optional<llvm::object::SectionedAddress> A;
  
  uVar2 = (this->Value).field_0.uval;
  if (DumpOpts.ShowAddresses == true) {
    WithColor::WithColor(&local_88,OS,Address,false);
    this_00 = local_88.OS;
  }
  else {
    this_00 = nulls();
  }
  if (DumpOpts.ShowAddresses != false) {
    WithColor::~WithColor(&local_88);
  }
  FVar1 = this->Form;
  if (DW_FORM_lo_user < FVar1) {
    if (FVar1 < DW_FORM_GNU_ref_alt) {
      if (FVar1 == DW_FORM_GNU_addr_index) goto switchD_00d8b64d_caseD_1b;
      if (FVar1 == DW_FORM_GNU_str_index) goto switchD_00d8b64d_caseD_1a;
      goto switchD_00d8b64d_caseD_2;
    }
    if (FVar1 == DW_FORM_GNU_ref_alt) goto LAB_00d8bb8b;
    if (FVar1 != DW_FORM_GNU_strp_alt) goto switchD_00d8b64d_caseD_2;
    if (DumpOpts.Verbose == true) {
      A.Storage._16_8_ = &PTR_home_01097f70;
      goto LAB_00d8b6e2;
    }
    goto LAB_00d8b6ea;
  }
  uVar4 = FVar1 - 1;
  if (0x2b < uVar4) {
switchD_00d8b64d_caseD_2:
    A.Storage._16_8_ = &PTR_home_01097da0;
    goto LAB_00d8bbce;
  }
  switch((uint)FVar1) {
  case 1:
    SectionIndex = (this->Value).SectionIndex;
    A.Storage._16_8_ = &PTR_home_01097f70;
    raw_ostream::operator<<(this_00,(format_object_base *)&A.Storage.hasVal);
    Obj = (this->U->Context->DObj)._M_t.
          super___uniq_ptr_impl<const_llvm::DWARFObject,_std::default_delete<const_llvm::DWARFObject>_>
          ._M_t.
          super__Tuple_impl<0UL,_const_llvm::DWARFObject_*,_std::default_delete<const_llvm::DWARFObject>_>
          .super__Head_base<0UL,_const_llvm::DWARFObject_*,_false>._M_head_impl;
LAB_00d8b9e6:
    dumpAddressSection(Obj,this_00,DumpOpts,SectionIndex);
    break;
  default:
    goto switchD_00d8b64d_caseD_2;
  case 3:
  case 4:
  case 9:
  case 10:
  case 0x18:
    if (uVar2 == 0) {
      return;
    }
    switch(FVar1) {
    case DW_FORM_block2:
      A.Storage._16_8_ = &PTR_home_01098078;
      break;
    case DW_FORM_block4:
      A.Storage._16_8_ = &PTR_home_01097f50;
      break;
    case DW_FORM_data2:
    case DW_FORM_data4:
    case DW_FORM_data8:
    case DW_FORM_string:
      goto switchD_00d8b672_caseD_5;
    case DW_FORM_block:
switchD_00d8b672_caseD_9:
      A.Storage._16_8_ = &PTR_home_01097f70;
      break;
    case DW_FORM_block1:
      A.Storage._16_8_ = &PTR_home_01098098;
      break;
    default:
      if (FVar1 == DW_FORM_exprloc) goto switchD_00d8b672_caseD_9;
      goto switchD_00d8b672_caseD_5;
    }
    raw_ostream::operator<<(this_00,(format_object_base *)&A.Storage.hasVal);
switchD_00d8b672_caseD_5:
    puVar8 = (this->Value).data;
    if (puVar8 != (uint8_t *)0x0) {
      if ((long)uVar2 < 1) {
        return;
      }
      puVar7 = puVar8 + uVar2;
      do {
        A.Storage._16_8_ = &PTR_home_01098098;
        raw_ostream::operator<<(this_00,(format_object_base *)&A.Storage.hasVal);
        puVar8 = puVar8 + 1;
      } while (puVar8 < puVar7);
      return;
    }
    pcVar6 = "NULL";
LAB_00d8bca3:
    sVar5 = 4;
    goto LAB_00d8bca8;
  case 5:
    A.Storage._16_8_ = &PTR_home_01098078;
    goto LAB_00d8bbce;
  case 6:
    goto LAB_00d8b947;
  case 7:
    A.Storage._16_8_ = &PTR_home_01097f70;
    goto LAB_00d8bbce;
  case 8:
    pcVar6 = OS->OutBufCur;
    if (pcVar6 < OS->OutBufEnd) {
      OS->OutBufCur = pcVar6 + 1;
      *pcVar6 = '\"';
    }
    else {
      raw_ostream::write(OS,0x22,(void *)((long)&switchD_00d8b64d::switchdataD_00e7e000 +
                                         (long)(int)(&switchD_00d8b64d::switchdataD_00e7e000)[uVar4]
                                         ),(ulong)FVar1);
    }
    pcVar6 = (this->Value).field_0.cstr;
    if (pcVar6 == (char *)0x0) {
      sVar3 = 0;
    }
    else {
      sVar3 = strlen(pcVar6);
    }
    __n = 0;
    Str_01.Length = sVar3;
    Str_01.Data = pcVar6;
    raw_ostream::write_escaped(OS,Str_01,false);
    pcVar6 = OS->OutBufCur;
    if (pcVar6 < OS->OutBufEnd) {
      OS->OutBufCur = pcVar6 + 1;
      *pcVar6 = '\"';
    }
    else {
      raw_ostream::write(OS,0x22,__buf,__n);
    }
    break;
  case 0xb:
  case 0xc:
    A.Storage._16_8_ = &PTR_home_01098098;
    goto LAB_00d8bbce;
  case 0xd:
    raw_ostream::operator<<(OS,(this->Value).field_0.sval);
    break;
  case 0xe:
    goto joined_r0x00d8b84f;
  case 0xf:
    raw_ostream::operator<<(OS,(this->Value).field_0.uval);
    break;
  case 0x10:
  case 0x20:
LAB_00d8bb8b:
    A.Storage._16_8_ = &PTR_home_01097f70;
    OS = this_00;
    goto LAB_00d8bbce;
  case 0x11:
    if (DumpOpts.Verbose != true) goto LAB_00d8bae2;
    A.Storage._16_8_ = &PTR_home_01098098;
    goto LAB_00d8bad6;
  case 0x12:
    if (DumpOpts.Verbose == true) {
      A.Storage._16_8_ = &PTR_home_01098078;
      goto LAB_00d8bad6;
    }
    goto LAB_00d8bae2;
  case 0x13:
    if (DumpOpts.Verbose == true) {
      A.Storage._16_8_ = &PTR_home_01097f50;
      goto LAB_00d8bad6;
    }
    goto LAB_00d8bae2;
  case 0x14:
    goto joined_r0x00d8b931;
  case 0x15:
joined_r0x00d8b931:
    if (DumpOpts.Verbose == true) {
      A.Storage._16_8_ = &PTR_home_01097f70;
LAB_00d8bad6:
      raw_ostream::operator<<(this_00,(format_object_base *)&A.Storage.hasVal);
    }
LAB_00d8bae2:
    if (DumpOpts.Verbose == true) {
      Str.Length = 5;
      Str.Data = " => {";
      raw_ostream::operator<<(OS,Str);
    }
    if (DumpOpts.ShowAddresses != false) {
      WithColor::WithColor((WithColor *)local_78,OS,Address,false);
      A.Storage._16_8_ = &PTR_home_01097f70;
      raw_ostream::operator<<((raw_ostream *)local_78,(format_object_base *)&A.Storage.hasVal);
      WithColor::~WithColor((WithColor *)local_78);
    }
    if (DumpOpts.Verbose == false) {
      return;
    }
    pcVar6 = "}";
    sVar5 = 1;
    goto LAB_00d8bca8;
  case 0x16:
    pcVar6 = "DW_FORM_indirect";
    sVar5 = 0x10;
    goto LAB_00d8bca8;
  case 0x17:
    A.Storage._16_8_ = &PTR_home_01097f50;
    OS = this_00;
    goto LAB_00d8bbce;
  case 0x19:
    pcVar6 = "true";
    goto LAB_00d8bca3;
  case 0x1a:
  case 0x25:
  case 0x26:
  case 0x27:
  case 0x28:
switchD_00d8b64d_caseD_1a:
    goto joined_r0x00d8b84f;
  case 0x1b:
  case 0x29:
  case 0x2a:
  case 0x2b:
  case 0x2c:
switchD_00d8b64d_caseD_1b:
    if (this->U == (DWARFUnit *)0x0) {
      pcVar6 = "<invalid dwarf unit>";
      sVar5 = 0x14;
    }
    else {
      DWARFUnit::getAddrOffsetSectionItem
                ((Optional<llvm::object::SectionedAddress> *)local_78,this->U,(uint32_t)uVar2);
      if ((A.Storage.field_0.value.SectionIndex._0_1_ != '\x01') || (DumpOpts.Verbose == true)) {
        A.Storage._16_8_ = &PTR_home_01097f50;
        raw_ostream::operator<<(this_00,(format_object_base *)&A.Storage.hasVal);
      }
      if (A.Storage.field_0.value.SectionIndex._0_1_ == '\x01') {
        A.Storage._16_8_ = &PTR_home_01097f70;
        raw_ostream::operator<<(this_00,(format_object_base *)&A.Storage.hasVal);
        Obj = (this->U->Context->DObj)._M_t.
              super___uniq_ptr_impl<const_llvm::DWARFObject,_std::default_delete<const_llvm::DWARFObject>_>
              ._M_t.
              super__Tuple_impl<0UL,_const_llvm::DWARFObject_*,_std::default_delete<const_llvm::DWARFObject>_>
              .super__Head_base<0UL,_const_llvm::DWARFObject_*,_false>._M_head_impl;
        SectionIndex = A.Storage.field_0.value.Address;
        goto LAB_00d8b9e6;
      }
      pcVar6 = "<no .debug_addr section>";
      sVar5 = 0x18;
    }
LAB_00d8bca8:
    Str_00.Length = sVar5;
    Str_00.Data = pcVar6;
    raw_ostream::operator<<(OS,Str_00);
    break;
  case 0x1e:
    A.Storage._16_8_ = (this->Value).data;
    raw_ostream::operator<<(OS,(FormattedBytes *)&A.Storage.hasVal);
    break;
  case 0x1f:
joined_r0x00d8b84f:
    if (DumpOpts.Verbose == true) {
      A.Storage._16_8_ = &PTR_home_01097f50;
LAB_00d8b6e2:
      raw_ostream::operator<<(OS,(format_object_base *)&A.Storage.hasVal);
    }
LAB_00d8b6ea:
    dumpString(this,OS);
    break;
  case 0x23:
LAB_00d8b947:
    A.Storage._16_8_ = &PTR_home_01097f50;
LAB_00d8bbce:
    raw_ostream::operator<<(OS,(format_object_base *)&A.Storage.hasVal);
  }
  return;
}

Assistant:

void DWARFFormValue::dump(raw_ostream &OS, DIDumpOptions DumpOpts) const {
  uint64_t UValue = Value.uval;
  bool CURelativeOffset = false;
  raw_ostream &AddrOS = DumpOpts.ShowAddresses
                            ? WithColor(OS, HighlightColor::Address).get()
                            : nulls();
  switch (Form) {
  case DW_FORM_addr:
    dumpSectionedAddress(AddrOS, DumpOpts, {Value.uval, Value.SectionIndex});
    break;
  case DW_FORM_addrx:
  case DW_FORM_addrx1:
  case DW_FORM_addrx2:
  case DW_FORM_addrx3:
  case DW_FORM_addrx4:
  case DW_FORM_GNU_addr_index: {
    if (U == nullptr) {
      OS << "<invalid dwarf unit>";
      break;
    }
    Optional<object::SectionedAddress> A = U->getAddrOffsetSectionItem(UValue);
    if (!A || DumpOpts.Verbose)
      AddrOS << format("indexed (%8.8x) address = ", (uint32_t)UValue);
    if (A)
      dumpSectionedAddress(AddrOS, DumpOpts, *A);
    else
      OS << "<no .debug_addr section>";
    break;
  }
  case DW_FORM_flag_present:
    OS << "true";
    break;
  case DW_FORM_flag:
  case DW_FORM_data1:
    OS << format("0x%02x", (uint8_t)UValue);
    break;
  case DW_FORM_data2:
    OS << format("0x%04x", (uint16_t)UValue);
    break;
  case DW_FORM_data4:
    OS << format("0x%08x", (uint32_t)UValue);
    break;
  case DW_FORM_ref_sig8:
    AddrOS << format("0x%016" PRIx64, UValue);
    break;
  case DW_FORM_data8:
    OS << format("0x%016" PRIx64, UValue);
    break;
  case DW_FORM_data16:
    OS << format_bytes(ArrayRef<uint8_t>(Value.data, 16), None, 16, 16);
    break;
  case DW_FORM_string:
    OS << '"';
    OS.write_escaped(Value.cstr);
    OS << '"';
    break;
  case DW_FORM_exprloc:
  case DW_FORM_block:
  case DW_FORM_block1:
  case DW_FORM_block2:
  case DW_FORM_block4:
    if (UValue > 0) {
      switch (Form) {
      case DW_FORM_exprloc:
      case DW_FORM_block:
        AddrOS << format("<0x%" PRIx64 "> ", UValue);
        break;
      case DW_FORM_block1:
        AddrOS << format("<0x%2.2x> ", (uint8_t)UValue);
        break;
      case DW_FORM_block2:
        AddrOS << format("<0x%4.4x> ", (uint16_t)UValue);
        break;
      case DW_FORM_block4:
        AddrOS << format("<0x%8.8x> ", (uint32_t)UValue);
        break;
      default:
        break;
      }

      const uint8_t *DataPtr = Value.data;
      if (DataPtr) {
        // UValue contains size of block
        const uint8_t *EndDataPtr = DataPtr + UValue;
        while (DataPtr < EndDataPtr) {
          AddrOS << format("%2.2x ", *DataPtr);
          ++DataPtr;
        }
      } else
        OS << "NULL";
    }
    break;

  case DW_FORM_sdata:
    OS << Value.sval;
    break;
  case DW_FORM_udata:
    OS << Value.uval;
    break;
  case DW_FORM_strp:
    if (DumpOpts.Verbose)
      OS << format(" .debug_str[0x%8.8x] = ", (uint32_t)UValue);
    dumpString(OS);
    break;
  case DW_FORM_line_strp:
    if (DumpOpts.Verbose)
      OS << format(" .debug_line_str[0x%8.8x] = ", (uint32_t)UValue);
    dumpString(OS);
    break;
  case DW_FORM_strx:
  case DW_FORM_strx1:
  case DW_FORM_strx2:
  case DW_FORM_strx3:
  case DW_FORM_strx4:
  case DW_FORM_GNU_str_index:
    if (DumpOpts.Verbose)
      OS << format("indexed (%8.8x) string = ", (uint32_t)UValue);
    dumpString(OS);
    break;
  case DW_FORM_GNU_strp_alt:
    if (DumpOpts.Verbose)
      OS << format("alt indirect string, offset: 0x%" PRIx64 "", UValue);
    dumpString(OS);
    break;
  case DW_FORM_ref_addr:
    AddrOS << format("0x%016" PRIx64, UValue);
    break;
  case DW_FORM_ref1:
    CURelativeOffset = true;
    if (DumpOpts.Verbose)
      AddrOS << format("cu + 0x%2.2x", (uint8_t)UValue);
    break;
  case DW_FORM_ref2:
    CURelativeOffset = true;
    if (DumpOpts.Verbose)
      AddrOS << format("cu + 0x%4.4x", (uint16_t)UValue);
    break;
  case DW_FORM_ref4:
    CURelativeOffset = true;
    if (DumpOpts.Verbose)
      AddrOS << format("cu + 0x%4.4x", (uint32_t)UValue);
    break;
  case DW_FORM_ref8:
    CURelativeOffset = true;
    if (DumpOpts.Verbose)
      AddrOS << format("cu + 0x%8.8" PRIx64, UValue);
    break;
  case DW_FORM_ref_udata:
    CURelativeOffset = true;
    if (DumpOpts.Verbose)
      AddrOS << format("cu + 0x%" PRIx64, UValue);
    break;
  case DW_FORM_GNU_ref_alt:
    AddrOS << format("<alt 0x%" PRIx64 ">", UValue);
    break;

  // All DW_FORM_indirect attributes should be resolved prior to calling
  // this function
  case DW_FORM_indirect:
    OS << "DW_FORM_indirect";
    break;

  case DW_FORM_rnglistx:
    OS << format("indexed (0x%x) rangelist = ", (uint32_t)UValue);
    break;

  // Should be formatted to 64-bit for DWARF64.
  case DW_FORM_sec_offset:
    AddrOS << format("0x%08x", (uint32_t)UValue);
    break;

  default:
    OS << format("DW_FORM(0x%4.4x)", Form);
    break;
  }

  if (CURelativeOffset) {
    if (DumpOpts.Verbose)
      OS << " => {";
    if (DumpOpts.ShowAddresses)
      WithColor(OS, HighlightColor::Address).get()
          << format("0x%8.8" PRIx64, UValue + (U ? U->getOffset() : 0));
    if (DumpOpts.Verbose)
      OS << "}";
  }
}